

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86_avx::forward_inplace(BatchNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  undefined8 *puVar13;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m128 _p128_2;
  __m256 _p256_2;
  int i_2;
  __m256 _b256_2;
  __m256 _a256_2;
  __m128 _b128_2;
  __m128 _a128_2;
  float b_1;
  float a_1;
  float *ptr_2;
  int q;
  int size_2;
  __m128 _p128_1;
  __m256 _p256_1;
  int j;
  __m256 _b256_1;
  __m256 _a256_1;
  __m128 _b128_1;
  __m128 _a128_1;
  float b;
  float a;
  float *ptr_1;
  int i_1;
  int size_1;
  __m128 _b128;
  __m128 _a128;
  __m128 _p128;
  __m256 _b256;
  __m256 _a256;
  __m256 _p256;
  int i;
  int size;
  float *bptr;
  float *aptr;
  float *ptr;
  int elempack;
  int c;
  int d;
  int h;
  int w;
  int dims;
  Mat *m;
  undefined1 local_be0 [28];
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined1 local_b40 [28];
  undefined8 local_b00;
  undefined8 uStack_af8;
  float fStack_ac4;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  int local_a84;
  undefined1 (*local_9c0) [12];
  int local_9b8;
  float fStack_9a4;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  int local_964;
  undefined1 (*local_8e0) [12];
  int local_8d8;
  float fStack_8a4;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  int local_838;
  float *local_830;
  float *local_828;
  undefined1 (*local_820) [12];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float local_f0;
  float fStack_ec;
  float fStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float local_d0;
  float fStack_cc;
  float fStack_c8;
  
  iVar12 = (int)in_RSI[5];
  iVar3 = *(int *)((long)in_RSI + 0x2c);
  lVar9 = in_RSI[6];
  iVar4 = *(int *)((long)in_RSI + 0x34);
  lVar10 = in_RSI[7];
  iVar5 = (int)in_RSI[3];
  if (iVar12 == 1) {
    local_820 = (undefined1 (*) [12])*in_RSI;
    local_828 = *(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8);
    local_830 = *(float **)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240);
    iVar11 = iVar3 * iVar5;
    for (local_838 = 0; local_838 + 7 < iVar11; local_838 = local_838 + 8) {
      auVar8 = *local_820;
      fStack_854 = (float)((ulong)*(undefined8 *)(*local_820 + 8) >> 0x20);
      fStack_850 = (float)*(undefined8 *)(local_820[1] + 4);
      fStack_84c = (float)((ulong)*(undefined8 *)(local_820[1] + 4) >> 0x20);
      fStack_848 = (float)*(undefined8 *)local_820[2];
      fStack_844 = (float)((ulong)*(undefined8 *)local_820[2] >> 0x20);
      local_640 = auVar8._0_4_;
      fStack_63c = auVar8._4_4_;
      fStack_638 = auVar8._8_4_;
      local_240 = (float)*(undefined8 *)local_830;
      fStack_23c = (float)((ulong)*(undefined8 *)local_830 >> 0x20);
      fStack_238 = (float)*(undefined8 *)(local_830 + 2);
      fStack_234 = (float)((ulong)*(undefined8 *)(local_830 + 2) >> 0x20);
      fStack_230 = (float)*(undefined8 *)(local_830 + 4);
      fStack_22c = (float)((ulong)*(undefined8 *)(local_830 + 4) >> 0x20);
      fStack_228 = (float)*(undefined8 *)(local_830 + 6);
      local_300 = (float)*(undefined8 *)local_828;
      fStack_2fc = (float)((ulong)*(undefined8 *)local_828 >> 0x20);
      fStack_2f8 = (float)*(undefined8 *)(local_828 + 2);
      fStack_2f4 = (float)((ulong)*(undefined8 *)(local_828 + 2) >> 0x20);
      fStack_2f0 = (float)*(undefined8 *)(local_828 + 4);
      fStack_2ec = (float)((ulong)*(undefined8 *)(local_828 + 4) >> 0x20);
      fStack_2e8 = (float)*(undefined8 *)(local_828 + 6);
      fStack_2e4 = (float)((ulong)*(undefined8 *)(local_828 + 6) >> 0x20);
      *(ulong *)*local_820 =
           CONCAT44(fStack_63c * fStack_23c + fStack_2fc,local_640 * local_240 + local_300);
      *(ulong *)(*local_820 + 8) =
           CONCAT44(fStack_854 * fStack_234 + fStack_2f4,fStack_638 * fStack_238 + fStack_2f8);
      *(ulong *)(local_820[1] + 4) =
           CONCAT44(fStack_84c * fStack_22c + fStack_2ec,fStack_850 * fStack_230 + fStack_2f0);
      *(ulong *)local_820[2] =
           CONCAT44(fStack_844 + fStack_2e4,fStack_848 * fStack_228 + fStack_2e8);
      local_820 = (undefined1 (*) [12])(local_820[2] + 8);
      local_828 = local_828 + 8;
      local_830 = local_830 + 8;
    }
    for (; local_838 + 3 < iVar11; local_838 = local_838 + 4) {
      auVar8 = *local_820;
      fStack_8a4 = (float)((ulong)*(undefined8 *)(*local_820 + 8) >> 0x20);
      local_110 = auVar8._0_4_;
      fStack_10c = auVar8._4_4_;
      fStack_108 = auVar8._8_4_;
      local_120 = (float)*(undefined8 *)local_830;
      fStack_11c = (float)((ulong)*(undefined8 *)local_830 >> 0x20);
      fStack_118 = (float)*(undefined8 *)(local_830 + 2);
      fStack_114 = (float)((ulong)*(undefined8 *)(local_830 + 2) >> 0x20);
      local_180 = (float)*(undefined8 *)local_828;
      fStack_17c = (float)((ulong)*(undefined8 *)local_828 >> 0x20);
      fStack_178 = (float)*(undefined8 *)(local_828 + 2);
      fStack_174 = (float)((ulong)*(undefined8 *)(local_828 + 2) >> 0x20);
      *(ulong *)*local_820 =
           CONCAT44(fStack_10c * fStack_11c + fStack_17c,local_110 * local_120 + local_180);
      *(ulong *)(*local_820 + 8) =
           CONCAT44(fStack_8a4 * fStack_114 + fStack_174,fStack_108 * fStack_118 + fStack_178);
      local_820 = (undefined1 (*) [12])(local_820[1] + 4);
      local_828 = local_828 + 4;
      local_830 = local_830 + 4;
    }
    for (; local_838 < iVar11; local_838 = local_838 + 1) {
      *(float *)*local_820 = *local_830 * *(float *)*local_820 + *local_828;
      local_820 = (undefined1 (*) [12])(*local_820 + 4);
      local_828 = local_828 + 1;
      local_830 = local_830 + 1;
    }
  }
  if (iVar12 == 2) {
    iVar11 = iVar3 * iVar5;
    for (local_8d8 = 0; local_8d8 < (int)lVar9; local_8d8 = local_8d8 + 1) {
      local_8e0 = (undefined1 (*) [12])
                  (*in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_8d8 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_8d8 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_8d8 * 4);
      if (iVar5 == 4) {
        puVar13 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_8d8 << 2) * 4);
        uVar6 = *puVar13;
        uVar7 = puVar13[1];
        puVar13 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_8d8 << 2) * 4);
        local_b00 = *puVar13;
        uStack_af8 = puVar13[1];
      }
      else {
        uVar6 = CONCAT44(fVar1,fVar1);
        uVar7 = CONCAT44(fVar1,fVar1);
        local_b00 = CONCAT44(fVar2,fVar2);
        uStack_af8 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar14 = *(undefined1 (*) [32])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_8d8 << 3) * 4);
        local_b40 = SUB3228(*(undefined1 (*) [32])
                             (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                             (long)(local_8d8 << 3) * 4),0);
      }
      else {
        auVar14._8_8_ = uVar7;
        auVar14._0_8_ = uVar6;
        auVar14._24_8_ = uVar7;
        auVar14._16_8_ = uVar6;
        auVar15._8_8_ = uStack_af8;
        auVar15._0_8_ = local_b00;
        auVar15._24_8_ = uStack_af8;
        auVar15._16_8_ = local_b00;
        local_b40 = auVar15._0_28_;
      }
      for (local_964 = 0; local_964 + 7 < iVar11; local_964 = local_964 + 8) {
        auVar8 = *local_8e0;
        fStack_994 = (float)((ulong)*(undefined8 *)(*local_8e0 + 8) >> 0x20);
        fStack_990 = (float)*(undefined8 *)(local_8e0[1] + 4);
        fStack_98c = (float)((ulong)*(undefined8 *)(local_8e0[1] + 4) >> 0x20);
        fStack_988 = (float)*(undefined8 *)local_8e0[2];
        fStack_984 = (float)((ulong)*(undefined8 *)local_8e0[2] >> 0x20);
        local_6a0 = auVar8._0_4_;
        fStack_69c = auVar8._4_4_;
        fStack_698 = auVar8._8_4_;
        local_200 = local_b40._0_4_;
        fStack_1fc = local_b40._4_4_;
        fStack_1f8 = local_b40._8_4_;
        fStack_1f4 = local_b40._12_4_;
        fStack_1f0 = local_b40._16_4_;
        fStack_1ec = local_b40._20_4_;
        fStack_1e8 = local_b40._24_4_;
        local_2c0 = auVar14._0_4_;
        fStack_2bc = auVar14._4_4_;
        fStack_2b8 = auVar14._8_4_;
        fStack_2b4 = auVar14._12_4_;
        fStack_2b0 = auVar14._16_4_;
        fStack_2ac = auVar14._20_4_;
        fStack_2a8 = auVar14._24_4_;
        fStack_2a4 = auVar14._28_4_;
        *(ulong *)*local_8e0 =
             CONCAT44(fStack_69c * fStack_1fc + fStack_2bc,local_6a0 * local_200 + local_2c0);
        *(ulong *)(*local_8e0 + 8) =
             CONCAT44(fStack_994 * fStack_1f4 + fStack_2b4,fStack_698 * fStack_1f8 + fStack_2b8);
        *(ulong *)(local_8e0[1] + 4) =
             CONCAT44(fStack_98c * fStack_1ec + fStack_2ac,fStack_990 * fStack_1f0 + fStack_2b0);
        *(ulong *)local_8e0[2] =
             CONCAT44(fStack_984 + fStack_2a4,fStack_988 * fStack_1e8 + fStack_2a8);
        local_8e0 = (undefined1 (*) [12])(local_8e0[2] + 8);
      }
      for (; local_964 + 3 < iVar11; local_964 = local_964 + 4) {
        auVar8 = *local_8e0;
        fStack_9a4 = (float)((ulong)*(undefined8 *)(*local_8e0 + 8) >> 0x20);
        local_f0 = auVar8._0_4_;
        fStack_ec = auVar8._4_4_;
        fStack_e8 = auVar8._8_4_;
        local_100 = (float)local_b00;
        fStack_fc = (float)((ulong)local_b00 >> 0x20);
        fStack_f8 = (float)uStack_af8;
        fStack_f4 = (float)((ulong)uStack_af8 >> 0x20);
        local_160 = (float)uVar6;
        fStack_15c = (float)((ulong)uVar6 >> 0x20);
        fStack_158 = (float)uVar7;
        fStack_154 = (float)((ulong)uVar7 >> 0x20);
        *(ulong *)*local_8e0 =
             CONCAT44(fStack_ec * fStack_fc + fStack_15c,local_f0 * local_100 + local_160);
        *(ulong *)(*local_8e0 + 8) =
             CONCAT44(fStack_9a4 * fStack_f4 + fStack_154,fStack_e8 * fStack_f8 + fStack_158);
        local_8e0 = (undefined1 (*) [12])(local_8e0[1] + 4);
      }
      for (; local_964 < iVar11; local_964 = local_964 + 1) {
        *(float *)*local_8e0 = fVar2 * *(float *)*local_8e0 + fVar1;
        local_8e0 = (undefined1 (*) [12])(*local_8e0 + 4);
      }
    }
  }
  if ((iVar12 == 3) || (iVar12 == 4)) {
    iVar12 = iVar3 * (int)lVar9 * iVar4 * iVar5;
    for (local_9b8 = 0; local_9b8 < (int)lVar10; local_9b8 = local_9b8 + 1) {
      local_9c0 = (undefined1 (*) [12])(*in_RSI + in_RSI[8] * (long)local_9b8 * in_RSI[2]);
      fVar1 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                        (long)local_9b8 * 4);
      fVar2 = *(float *)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                        (long)local_9b8 * 4);
      if (iVar5 == 4) {
        puVar13 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                  (long)(local_9b8 << 2) * 4);
        uVar6 = *puVar13;
        uVar7 = puVar13[1];
        puVar13 = (undefined8 *)
                  (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                  (long)(local_9b8 << 2) * 4);
        local_b90 = *puVar13;
        uStack_b88 = puVar13[1];
      }
      else {
        uVar6 = CONCAT44(fVar1,fVar1);
        uVar7 = CONCAT44(fVar1,fVar1);
        local_b90 = CONCAT44(fVar2,fVar2);
        uStack_b88 = CONCAT44(fVar2,fVar2);
      }
      if (iVar5 == 8) {
        auVar16 = *(undefined1 (*) [32])
                   (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8) +
                   (long)(local_9b8 << 3) * 4);
        local_be0 = SUB3228(*(undefined1 (*) [32])
                             (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240) +
                             (long)(local_9b8 << 3) * 4),0);
      }
      else {
        auVar16._8_8_ = uVar7;
        auVar16._0_8_ = uVar6;
        auVar16._24_8_ = uVar7;
        auVar16._16_8_ = uVar6;
        auVar17._8_8_ = uStack_b88;
        auVar17._0_8_ = local_b90;
        auVar17._24_8_ = uStack_b88;
        auVar17._16_8_ = local_b90;
        local_be0 = auVar17._0_28_;
      }
      for (local_a84 = 0; local_a84 + 7 < iVar12; local_a84 = local_a84 + 8) {
        auVar8 = *local_9c0;
        fStack_ab4 = (float)((ulong)*(undefined8 *)(*local_9c0 + 8) >> 0x20);
        fStack_ab0 = (float)*(undefined8 *)(local_9c0[1] + 4);
        fStack_aac = (float)((ulong)*(undefined8 *)(local_9c0[1] + 4) >> 0x20);
        fStack_aa8 = (float)*(undefined8 *)local_9c0[2];
        fStack_aa4 = (float)((ulong)*(undefined8 *)local_9c0[2] >> 0x20);
        local_700 = auVar8._0_4_;
        fStack_6fc = auVar8._4_4_;
        fStack_6f8 = auVar8._8_4_;
        local_1c0 = local_be0._0_4_;
        fStack_1bc = local_be0._4_4_;
        fStack_1b8 = local_be0._8_4_;
        fStack_1b4 = local_be0._12_4_;
        fStack_1b0 = local_be0._16_4_;
        fStack_1ac = local_be0._20_4_;
        fStack_1a8 = local_be0._24_4_;
        local_280 = auVar16._0_4_;
        fStack_27c = auVar16._4_4_;
        fStack_278 = auVar16._8_4_;
        fStack_274 = auVar16._12_4_;
        fStack_270 = auVar16._16_4_;
        fStack_26c = auVar16._20_4_;
        fStack_268 = auVar16._24_4_;
        fStack_264 = auVar16._28_4_;
        *(ulong *)*local_9c0 =
             CONCAT44(fStack_6fc * fStack_1bc + fStack_27c,local_700 * local_1c0 + local_280);
        *(ulong *)(*local_9c0 + 8) =
             CONCAT44(fStack_ab4 * fStack_1b4 + fStack_274,fStack_6f8 * fStack_1b8 + fStack_278);
        *(ulong *)(local_9c0[1] + 4) =
             CONCAT44(fStack_aac * fStack_1ac + fStack_26c,fStack_ab0 * fStack_1b0 + fStack_270);
        *(ulong *)local_9c0[2] =
             CONCAT44(fStack_aa4 + fStack_264,fStack_aa8 * fStack_1a8 + fStack_268);
        local_9c0 = (undefined1 (*) [12])(local_9c0[2] + 8);
      }
      for (; local_a84 + 3 < iVar12; local_a84 = local_a84 + 4) {
        auVar8 = *local_9c0;
        fStack_ac4 = (float)((ulong)*(undefined8 *)(*local_9c0 + 8) >> 0x20);
        local_d0 = auVar8._0_4_;
        fStack_cc = auVar8._4_4_;
        fStack_c8 = auVar8._8_4_;
        local_e0 = (float)local_b90;
        fStack_dc = (float)((ulong)local_b90 >> 0x20);
        fStack_d8 = (float)uStack_b88;
        fStack_d4 = (float)((ulong)uStack_b88 >> 0x20);
        local_140 = (float)uVar6;
        fStack_13c = (float)((ulong)uVar6 >> 0x20);
        fStack_138 = (float)uVar7;
        fStack_134 = (float)((ulong)uVar7 >> 0x20);
        *(ulong *)*local_9c0 =
             CONCAT44(fStack_cc * fStack_dc + fStack_13c,local_d0 * local_e0 + local_140);
        *(ulong *)(*local_9c0 + 8) =
             CONCAT44(fStack_ac4 * fStack_d4 + fStack_134,fStack_c8 * fStack_d8 + fStack_138);
        local_9c0 = (undefined1 (*) [12])(local_9c0[1] + 4);
      }
      for (; local_a84 < iVar12; local_a84 = local_a84 + 1) {
        *(float *)*local_9c0 = fVar2 * *(float *)*local_9c0 + fVar1;
        local_9c0 = (undefined1 (*) [12])(*local_9c0 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}